

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

string * google::protobuf::compiler::cpp::FieldComment<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *field,Options *options)

{
  ushort *puVar1;
  allocator<char> local_b4;
  DebugStringOptions local_b3;
  const_iterator __begin0;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  const_iterator __end0;
  string_view chunk;
  
  if (options->strip_nonfunctional_codegen == true) {
    puVar1 = (ushort *)(field->all_names_).payload_;
    __begin0.pos_ = (size_t)*puVar1;
    __begin0._8_8_ = (long)puVar1 + ~__begin0.pos_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&__begin0,
               (allocator<char> *)&__end0);
  }
  else {
    local_b3.include_comments = false;
    local_b3.elide_group_body = true;
    local_b3.elide_oneof_body = true;
    FieldDescriptor::DebugStringWithOptions_abi_cxx11_((string *)&__begin0,field,&local_b3);
    absl::lts_20250127::
    StrSplit<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin0,'\n');
    std::__cxx11::string::~string((string *)&__begin0);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::begin(&__begin0,&local_80);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::end(&__end0,&local_80);
    if ((__begin0.state_ == __end0.state_) && (__begin0.pos_ == __end0.pos_)) {
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"<unknown>",(allocator<char> *)&__begin0);
    }
    else {
      chunk._M_len = __begin0.curr_._M_len;
      chunk._M_str = __begin0.curr_._M_str;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&chunk,&local_b4);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldComment(const T* field, const Options& options) {
  if (options.strip_nonfunctional_codegen) {
    return std::string(field->name());
  }
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions debug_options;
  debug_options.elide_group_body = true;
  debug_options.elide_oneof_body = true;

  for (absl::string_view chunk :
       absl::StrSplit(field->DebugStringWithOptions(debug_options), '\n')) {
    return std::string(chunk);
  }

  return "<unknown>";
}